

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void glad_gl_load_GL_ARB_vertex_buffer_object(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_ARB_vertex_buffer_object != 0) {
    glad_glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)(*load)("glUnmapBuffer",userptr);
    glad_glBindBufferARB = (PFNGLBINDBUFFERARBPROC)(*load)("glBindBufferARB",userptr);
    glad_glMapBufferARB = (PFNGLMAPBUFFERARBPROC)(*load)("glMapBufferARB",userptr);
    glad_glBufferDataARB = (PFNGLBUFFERDATAARBPROC)(*load)("glBufferDataARB",userptr);
    glad_glGetBufferSubData = (PFNGLGETBUFFERSUBDATAPROC)(*load)("glGetBufferSubData",userptr);
    glad_glGenBuffersARB = (PFNGLGENBUFFERSARBPROC)(*load)("glGenBuffersARB",userptr);
    glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*load)("glGenBuffers",userptr);
    glad_glIsBufferARB = (PFNGLISBUFFERARBPROC)(*load)("glIsBufferARB",userptr);
    glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*load)("glBindBuffer",userptr);
    glad_glGetBufferSubDataARB =
         (PFNGLGETBUFFERSUBDATAARBPROC)(*load)("glGetBufferSubDataARB",userptr);
    glad_glGetBufferPointervARB =
         (PFNGLGETBUFFERPOINTERVARBPROC)(*load)("glGetBufferPointervARB",userptr);
    glad_glMapBuffer = (PFNGLMAPBUFFERPROC)(*load)("glMapBuffer",userptr);
    glad_glBufferData = (PFNGLBUFFERDATAPROC)(*load)("glBufferData",userptr);
    glad_glDeleteBuffersARB = (PFNGLDELETEBUFFERSARBPROC)(*load)("glDeleteBuffersARB",userptr);
    glad_glUnmapBufferARB = (PFNGLUNMAPBUFFERARBPROC)(*load)("glUnmapBufferARB",userptr);
    glad_glGetBufferParameteriv =
         (PFNGLGETBUFFERPARAMETERIVPROC)(*load)("glGetBufferParameteriv",userptr);
    glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*load)("glBufferSubData",userptr);
    glad_glBufferSubDataARB = (PFNGLBUFFERSUBDATAARBPROC)(*load)("glBufferSubDataARB",userptr);
    glad_glGetBufferParameterivARB =
         (PFNGLGETBUFFERPARAMETERIVARBPROC)(*load)("glGetBufferParameterivARB",userptr);
    glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*load)("glDeleteBuffers",userptr);
    glad_glGetBufferPointerv = (PFNGLGETBUFFERPOINTERVPROC)(*load)("glGetBufferPointerv",userptr);
    glad_glIsBuffer = (PFNGLISBUFFERPROC)(*load)("glIsBuffer",userptr);
  }
  return;
}

Assistant:

static void glad_gl_load_GL_ARB_vertex_buffer_object( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_ARB_vertex_buffer_object) return;
    glUnmapBuffer = (PFNGLUNMAPBUFFERPROC) load("glUnmapBuffer", userptr);
    glBindBufferARB = (PFNGLBINDBUFFERARBPROC) load("glBindBufferARB", userptr);
    glMapBufferARB = (PFNGLMAPBUFFERARBPROC) load("glMapBufferARB", userptr);
    glBufferDataARB = (PFNGLBUFFERDATAARBPROC) load("glBufferDataARB", userptr);
    glGetBufferSubData = (PFNGLGETBUFFERSUBDATAPROC) load("glGetBufferSubData", userptr);
    glGenBuffersARB = (PFNGLGENBUFFERSARBPROC) load("glGenBuffersARB", userptr);
    glGenBuffers = (PFNGLGENBUFFERSPROC) load("glGenBuffers", userptr);
    glIsBufferARB = (PFNGLISBUFFERARBPROC) load("glIsBufferARB", userptr);
    glBindBuffer = (PFNGLBINDBUFFERPROC) load("glBindBuffer", userptr);
    glGetBufferSubDataARB = (PFNGLGETBUFFERSUBDATAARBPROC) load("glGetBufferSubDataARB", userptr);
    glGetBufferPointervARB = (PFNGLGETBUFFERPOINTERVARBPROC) load("glGetBufferPointervARB", userptr);
    glMapBuffer = (PFNGLMAPBUFFERPROC) load("glMapBuffer", userptr);
    glBufferData = (PFNGLBUFFERDATAPROC) load("glBufferData", userptr);
    glDeleteBuffersARB = (PFNGLDELETEBUFFERSARBPROC) load("glDeleteBuffersARB", userptr);
    glUnmapBufferARB = (PFNGLUNMAPBUFFERARBPROC) load("glUnmapBufferARB", userptr);
    glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC) load("glGetBufferParameteriv", userptr);
    glBufferSubData = (PFNGLBUFFERSUBDATAPROC) load("glBufferSubData", userptr);
    glBufferSubDataARB = (PFNGLBUFFERSUBDATAARBPROC) load("glBufferSubDataARB", userptr);
    glGetBufferParameterivARB = (PFNGLGETBUFFERPARAMETERIVARBPROC) load("glGetBufferParameterivARB", userptr);
    glDeleteBuffers = (PFNGLDELETEBUFFERSPROC) load("glDeleteBuffers", userptr);
    glGetBufferPointerv = (PFNGLGETBUFFERPOINTERVPROC) load("glGetBufferPointerv", userptr);
    glIsBuffer = (PFNGLISBUFFERPROC) load("glIsBuffer", userptr);
}